

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O1

void __thiscall QSplitterHandle::mousePressEvent(QSplitterHandle *this,QMouseEvent *e)

{
  long lVar1;
  undefined4 uVar2;
  uint uVar3;
  double extraout_XMM0_Qa;
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double in_XMM1_Qa;
  undefined1 auVar7 [16];
  
  if (*(int *)(e + 0x40) != 1) {
    return;
  }
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  uVar2 = QEventPoint::position();
  auVar7._0_8_ = (double)((ulong)in_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) + in_XMM1_Qa;
  auVar7._8_8_ = (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                 extraout_XMM0_Qa;
  auVar5 = minpd(_DAT_0066f5d0,auVar7);
  dVar4 = auVar5._0_8_;
  dVar6 = auVar5._8_8_;
  auVar5._8_8_ = -(ulong)(-2147483648.0 < dVar6);
  auVar5._0_8_ = -(ulong)(-2147483648.0 < dVar4);
  uVar3 = movmskpd(uVar2,auVar5);
  if ((uVar3 & 2) == 0) {
    dVar6 = -2147483648.0;
  }
  if ((uVar3 & 1) == 0) {
    dVar4 = -2147483648.0;
  }
  if (*(int *)(lVar1 + 0x260) != 1) {
    dVar6 = dVar4;
  }
  *(int *)(lVar1 + 0x264) = (int)dVar6;
  *(byte *)(lVar1 + 0x268) = *(byte *)(lVar1 + 0x268) | 4;
  QWidget::update(&this->super_QWidget);
  return;
}

Assistant:

void QSplitterHandle::mousePressEvent(QMouseEvent *e)
{
    Q_D(QSplitterHandle);
    if (e->button() == Qt::LeftButton) {
        d->mouseOffset = d->pick(e->position().toPoint());
        d->pressed = true;
        update();
    }
}